

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::SwapCoordinates(ON_BoundingBox *this,int i,int j)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  double t;
  bool rc;
  int j_local;
  int i_local;
  ON_BoundingBox *this_local;
  
  t._7_1_ = false;
  bVar3 = IsValid(this);
  if ((((bVar3) && (-1 < i)) && (i < 3)) && (((-1 < j && (j < 3)) && (t._7_1_ = true, i != j)))) {
    pdVar4 = ON_3dPoint::operator[](&this->m_min,i);
    dVar1 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,j);
    dVar2 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,i);
    *pdVar4 = dVar2;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,j);
    *pdVar4 = dVar1;
    pdVar4 = ON_3dPoint::operator[](&this->m_max,i);
    dVar1 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_max,j);
    dVar2 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_max,i);
    *pdVar4 = dVar2;
    pdVar4 = ON_3dPoint::operator[](&this->m_max,j);
    *pdVar4 = dVar1;
  }
  return t._7_1_;
}

Assistant:

bool ON_BoundingBox::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( IsValid() && 0 <= i && i < 3 && 0 <= j && j < 3 ) {
    rc = true;
    if ( i != j ) {
      double t = m_min[i]; m_min[i] = m_min[j]; m_min[j] = t;
      t = m_max[i]; m_max[i] = m_max[j]; m_max[j] = t;
    }
  }
  return rc;
}